

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  long lVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  clock_t cVar5;
  clock_t cVar6;
  bool *pbVar7;
  long lVar8;
  long lVar9;
  char *pcVar10;
  bool bVar11;
  char *__s;
  
  if (argc < 2) {
    printf("No test hash given on command line, testing %s.\n","xxh3");
    puts(
        "Usage: SMHasher [--list][--listnames][--tests] [--verbose][--extra]\n       [--test=Speed,...] hash"
        );
  }
  lVar9 = 1;
  pcVar10 = "xxh3";
  do {
    if (argc <= lVar9) {
      cVar5 = clock();
      testHash(pcVar10);
      cVar6 = clock();
      putchar(10);
      fflush((FILE *)0x0);
      if (g_testAll == false) {
        fprintf(_stderr,"Input vcode 0x%08x, Output vcode 0x%08x, Result vcode 0x%08x\n",
                (ulong)g_inputVCode,(ulong)g_outputVCode,(ulong)g_resultVCode);
        fprintf(_stderr,"Verification value is 0x%08x - Testing took %f seconds\n",
                (double)((int)cVar6 - (int)cVar5) / 1000000.0,(ulong)g_verify);
      }
      else {
        printf("Input vcode 0x%08x, Output vcode 0x%08x, Result vcode 0x%08x\n",(ulong)g_inputVCode,
               (ulong)g_outputVCode,(ulong)g_resultVCode);
        printf("Verification value is 0x%08x - Testing took %f seconds\n",
               (double)((int)cVar6 - (int)cVar5) / 1000000.0,(ulong)g_verify);
        puts("-------------------------------------------------------------------------------");
      }
      fflush((FILE *)0x0);
      return 0;
    }
    pcVar4 = argv[lVar9];
    if ((*pcVar4 == '-') && (pcVar4[1] == '-')) {
      iVar2 = strcmp(pcVar4,"--help");
      if (iVar2 == 0) {
        puts(
            "Usage: SMHasher [--list][--listnames][--tests] [--verbose][--extra]\n       [--test=Speed,...] hash"
            );
        goto LAB_0010822b;
      }
      iVar2 = strcmp(pcVar4,"--list");
      if (iVar2 == 0) {
        for (lVar9 = 0x20; lVar9 != 0x1790; lVar9 = lVar9 + 0x28) {
          printf("%-16s\t\"%s\" %s\n",*(undefined8 *)((long)quality_str + lVar9 + 0x10),
                 *(undefined8 *)(lVar9 + 0x1ce398),
                 quality_str[*(uint *)((long)&g_hashes[0].hash + lVar9)]);
        }
LAB_0010822b:
        exit(0);
      }
      iVar2 = strcmp(pcVar4,"--listnames");
      if (iVar2 == 0) {
        for (lVar9 = 0x10; lVar9 != 0x1780; lVar9 = lVar9 + 0x28) {
          puts(*(char **)((long)&g_hashes[0].hash + lVar9));
        }
        goto LAB_0010822b;
      }
      iVar2 = strcmp(pcVar4,"--tests");
      if (iVar2 == 0) {
        puts("Valid tests:");
        for (lVar9 = 8; lVar9 != 0x148; lVar9 = lVar9 + 0x10) {
          printf("  %s\n",*(undefined8 *)((long)&g_testopts[0].var + lVar9));
        }
        goto LAB_0010822b;
      }
      iVar2 = strcmp(pcVar4,"--verbose");
      pbVar7 = &g_drawDiagram;
      if (iVar2 != 0) {
        iVar2 = strcmp(pcVar4,"--extra");
        pbVar7 = &g_testExtra;
        if (iVar2 != 0) {
          iVar2 = strncmp(pcVar4,"--test=",6);
          if (iVar2 != 0) {
            puts("Invalid command ");
            pcVar10 = 
            "Usage: SMHasher [--list][--listnames][--tests] [--verbose][--extra]\n       [--test=Speed,...] hash"
            ;
LAB_00108212:
            puts(pcVar10);
            exit(1);
          }
          __s = pcVar4 + 7;
          bVar11 = false;
          g_testAll = false;
          do {
            pcVar3 = strchr(__s,0x2c);
            pcVar4 = __s;
            if (pcVar3 != (char *)0x0) {
              pcVar4 = strndup(__s,(long)pcVar3 - (long)__s);
              __s = pcVar3 + 1;
            }
            lVar1 = -0x10;
            do {
              lVar8 = lVar1;
              if (lVar8 + 0x10 == 0x140) {
                if (!bVar11) {
                  printf("Invalid option: --test=%s\n",pcVar4);
                  printf("Valid tests: --test=%s",g_testopts[0].name);
                  for (lVar9 = 0x18; lVar9 != 0x148; lVar9 = lVar9 + 0x10) {
                    printf(",%s",*(undefined8 *)((long)&g_testopts[0].var + lVar9));
                  }
                  pcVar10 = " ";
                  goto LAB_00108212;
                }
                goto LAB_0010809d;
              }
              iVar2 = strcmp(pcVar4,*(char **)((long)&g_testopts[1].name + lVar8));
              lVar1 = lVar8 + 0x10;
            } while (iVar2 != 0);
            **(undefined1 **)((long)&g_testopts[1].var + lVar8) = 1;
LAB_0010809d:
            bVar11 = true;
            pcVar4 = pcVar10;
          } while (pcVar3 != (char *)0x0);
          goto LAB_001080be;
        }
      }
      *pbVar7 = true;
      pcVar4 = pcVar10;
    }
LAB_001080be:
    lVar9 = lVar9 + 1;
    pcVar10 = pcVar4;
  } while( true );
}

Assistant:

int main ( int argc, const char ** argv )
{
#ifdef DEBUG
  const char * defaulthash = "wysha";
#elif defined(__x86_64__) || defined(_M_X64) || defined(_X86_64_)
  const char * defaulthash = "xxh3";
#else
  const char * defaulthash = "wyhash";
#endif
  const char * hashToTest = defaulthash;

  if (argc < 2) {
    printf("No test hash given on command line, testing %s.\n", hashToTest);
    printf("Usage: SMHasher [--list][--listnames][--tests] [--verbose][--extra]\n"
           "       [--test=Speed,...] hash\n");
  }

  for (int argnb = 1; argnb < argc; argnb++) {
    const char* const arg = argv[argnb];
    if (strncmp(arg,"--", 2) == 0) {
      // This is a command
      if (strcmp(arg,"--help") == 0) {
        printf("Usage: SMHasher [--list][--listnames][--tests] [--verbose][--extra]\n"
               "       [--test=Speed,...] hash\n");
        exit(0);
      }
      if (strcmp(arg,"--list") == 0) {
        for(size_t i = 0; i < sizeof(g_hashes) / sizeof(HashInfo); i++) {
          printf("%-16s\t\"%s\" %s\n", g_hashes[i].name, g_hashes[i].desc, quality_str[g_hashes[i].quality]);
        }
        exit(0);
      }
      if (strcmp(arg,"--listnames") == 0) {
        for(size_t i = 0; i < sizeof(g_hashes) / sizeof(HashInfo); i++) {
          printf("%s\n", g_hashes[i].name);
        }
        exit(0);
      }
      if (strcmp(arg,"--tests") == 0) {
        printf("Valid tests:\n");
        for(size_t i = 0; i < sizeof(g_testopts) / sizeof(TestOpts); i++) {
          printf("  %s\n", g_testopts[i].name);
        }
        exit(0);
      }
      if (strcmp(arg,"--verbose") == 0) {
        g_drawDiagram = true;
        continue;
      }
      if (strcmp(arg,"--extra") == 0) {
        g_testExtra = true;
        continue;
      }
      /* default: --test=All. comma seperated list of options */
      if (strncmp(arg,"--test=", 6) == 0) {
        char *opt = (char *)&arg[7];
        char *rest = opt;
        char *p;
        bool found = false;
        g_testAll = false;
        do {
          if ((p = strchr(rest, ','))) {
            opt = strndup(rest, p-rest);
            rest = p+1;
          } else {
            opt = rest;
          }
          for (size_t i = 0; i < sizeof(g_testopts) / sizeof(TestOpts); i++) {
            if (strcmp(opt, g_testopts[i].name) == 0) {
              g_testopts[i].var = true; found = true; break;
            }
          }
          if (!found) {
            printf("Invalid option: --test=%s\n", opt);
            printf("Valid tests: --test=%s", g_testopts[0].name);
            for(size_t i = 1; i < sizeof(g_testopts) / sizeof(TestOpts); i++) {
              printf(",%s", g_testopts[i].name);
            }
            printf(" \n");
            exit(1);
          }
        } while (p);
        continue;
      }
      // invalid command
      printf("Invalid command \n");
      printf("Usage: SMHasher [--list][--listnames][--tests] [--verbose][--extra]\n"
             "       [--test=Speed,...] hash\n");
      exit(1);
    }
    // Not a command ? => interprested as hash name
    hashToTest = arg;
  }

  // Code runs on the 3rd CPU by default? only for speed tests
  //SetAffinity((1 << 2));
  //SelfTest();

  int timeBegin = clock();

  testHash(hashToTest);

  int timeEnd = clock();

  printf("\n");
  fflush(NULL);
  if (g_testAll) {
    printf("Input vcode 0x%08x, Output vcode 0x%08x, Result vcode 0x%08x\n", g_inputVCode, g_outputVCode, g_resultVCode);
    printf("Verification value is 0x%08x - Testing took %f seconds\n", g_verify, double(timeEnd-timeBegin)/double(CLOCKS_PER_SEC));
    printf("-------------------------------------------------------------------------------\n");
  } else {
    fprintf(stderr, "Input vcode 0x%08x, Output vcode 0x%08x, Result vcode 0x%08x\n", g_inputVCode, g_outputVCode, g_resultVCode);
    fprintf(stderr, "Verification value is 0x%08x - Testing took %f seconds\n", g_verify, double(timeEnd-timeBegin)/double(CLOCKS_PER_SEC));
  }
    fflush(NULL);
  return 0;
}